

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global_object.cpp
# Opt level: O0

wstring * __thiscall
mjs::index_string_abi_cxx11_(wstring *__return_storage_ptr__,mjs *this,uint32_t index)

{
  wchar_t *__s;
  allocator<wchar_t> local_51;
  wchar_t *local_50;
  wchar_t *p;
  wchar_t buffer [12];
  uint32_t index_local;
  
  buffer[0xb] = (wchar_t)this;
  if (buffer[0xb] != L'\xffffffff') {
    buffer[9] = L'\0';
    local_50 = buffer + 9;
    do {
      __s = local_50 + -1;
      local_50[-1] = (uint)buffer[0xb] % 10 + L'0';
      buffer[0xb] = (uint)buffer[0xb] / 10;
      local_50 = __s;
    } while (buffer[0xb] != L'\0');
    std::allocator<wchar_t>::allocator();
    std::__cxx11::wstring::wstring<std::allocator<wchar_t>>
              ((wstring *)__return_storage_ptr__,__s,&local_51);
    std::allocator<wchar_t>::~allocator(&local_51);
    return __return_storage_ptr__;
  }
  __assert_fail("index != UINT32_MAX",
                "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/global_object.cpp"
                ,0x30b,"std::wstring mjs::index_string(uint32_t)");
}

Assistant:

std::wstring index_string(uint32_t index) {
    assert(index != UINT32_MAX);
    wchar_t buffer[12], *p = &buffer[sizeof(buffer)/sizeof(*buffer)];
    *--p = '\0';
    do {
        *--p = '0' + index % 10;
        index /= 10;
    } while (index);
    return std::wstring{p};
}